

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

void __thiscall Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBNoLeafNode *b)

{
  float *pfVar1;
  uint uVar2;
  MeshInterface *pMVar3;
  bool bVar4;
  udword uVar5;
  int *piVar6;
  Point *pPVar7;
  Point *pPVar8;
  Point *pPVar9;
  Container *pCVar10;
  Point *pPVar11;
  Point *pPVar12;
  Point *pPVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float local_dc4;
  float local_dc0;
  float local_dbc;
  float local_db4;
  float local_db0;
  float local_dac;
  float local_da4;
  float local_da0;
  float local_d9c;
  float local_d94;
  float local_d90;
  float local_d8c;
  float local_d84;
  float local_d80;
  float local_d7c;
  float local_d74;
  float local_d70;
  float local_d6c;
  AABBNoLeafNode *b_local;
  AABBTreeCollider *this_local;
  float tmp_8;
  float tmp_7;
  float fex2;
  float tmp_6;
  float fez2;
  float fey2;
  Point e2;
  float tmp_5;
  float tmp_4;
  float fex1;
  float tmp_3;
  float fez1;
  float fey1;
  float tmp_2;
  float tmp_1;
  float fex0;
  float tmp;
  float fez0;
  float fey0;
  float max;
  float min;
  float rad;
  float local_cd0;
  float d;
  Point normal;
  Point e1;
  Point e0;
  Point v2;
  Point v1;
  Point v0;
  int local_c5c;
  VertexPointers VP_1;
  IndexedTriangle *T_1;
  float c_5;
  float c_4;
  float tmp_10;
  float isect2_1 [2];
  float isect1_1 [2];
  float xxyy_1;
  float yy_1;
  float xx_1;
  float y1_1;
  float y0_1;
  float f_1;
  float e_1;
  float d_2;
  float x1_1;
  float x0_1;
  float c_3;
  float b_2;
  float a_1;
  float up2_1;
  float up1_1;
  float up0_1;
  float vp2_1;
  float vp1_1;
  float vp0_1;
  float cc_1;
  float bb_1;
  short index_1;
  float max_2;
  Point D_1;
  float dv0dv2_1;
  float dv0dv1_1;
  float dv2_1;
  float dv1_1;
  float dv0_1;
  float d2_1;
  Point N2_1;
  float local_a94;
  float fStack_a90;
  float du0du2_1;
  float du0du1_1;
  float du2_1;
  float du1_1;
  float du0_1;
  undefined1 local_a60 [4];
  float d1_1;
  Point N1_1;
  float local_a48;
  float fStack_a44;
  Point E2_1;
  Point E1_1;
  int local_9f4;
  VertexPointers VP;
  IndexedTriangle *T;
  float c_2;
  float c_1;
  float tmp_9;
  float isect2 [2];
  float isect1 [2];
  float xxyy;
  float yy;
  float xx;
  float y1;
  float y0;
  float f;
  float e;
  float d_1;
  float x1;
  float x0;
  float c;
  float b_1;
  float a;
  float up2;
  float up1;
  float up0;
  float vp2;
  float vp1;
  float vp0;
  float cc;
  float bb;
  short index;
  float max_1;
  Point D;
  float dv0dv2;
  float dv0dv1;
  float dv2;
  float dv1;
  float dv0;
  float d2;
  Point N2;
  float local_7fc;
  float fStack_7f8;
  float du0du2;
  float du0du1;
  float du2;
  float du1;
  float du0;
  undefined1 local_7c8 [4];
  float d1;
  Point N1;
  float local_7b0;
  float fStack_7ac;
  Point E2;
  Point E1;
  int local_75c;
  uint local_e8;
  udword q;
  float local_d8 [2];
  Point vmax;
  Point vmin;
  
  pPVar7 = &(b->mAABB).mExtents;
  this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
  fVar14 = this->mLeafVerts[0].x - (b->mAABB).mCenter.x;
  fVar15 = this->mLeafVerts[1].x - (b->mAABB).mCenter.x;
  fVar16 = this->mLeafVerts[2].x - (b->mAABB).mCenter.x;
  if (fVar15 <= fVar14) {
    local_d74 = fVar16;
    if (fVar15 < fVar16) {
      local_d74 = fVar15;
    }
    local_d70 = local_d74;
  }
  else {
    local_d6c = fVar16;
    if (fVar14 < fVar16) {
      local_d6c = fVar14;
    }
    local_d70 = local_d6c;
  }
  if (local_d70 < pPVar7->x || local_d70 == pPVar7->x) {
    if (fVar15 <= fVar14) {
      local_d84 = fVar14;
      if (fVar14 < fVar16) {
        local_d84 = fVar16;
      }
      local_d80 = local_d84;
    }
    else {
      local_d7c = fVar15;
      if (fVar15 < fVar16) {
        local_d7c = fVar16;
      }
      local_d80 = local_d7c;
    }
    if (-pPVar7->x <= local_d80) {
      fVar29 = this->mLeafVerts[0].y - (b->mAABB).mCenter.y;
      fVar17 = this->mLeafVerts[1].y - (b->mAABB).mCenter.y;
      fVar18 = this->mLeafVerts[2].y - (b->mAABB).mCenter.y;
      if (fVar17 <= fVar29) {
        local_d94 = fVar18;
        if (fVar17 < fVar18) {
          local_d94 = fVar17;
        }
        local_d90 = local_d94;
      }
      else {
        local_d8c = fVar18;
        if (fVar29 < fVar18) {
          local_d8c = fVar29;
        }
        local_d90 = local_d8c;
      }
      pfVar1 = &(b->mAABB).mExtents.y;
      if (local_d90 < *pfVar1 || local_d90 == *pfVar1) {
        if (fVar17 <= fVar29) {
          local_da4 = fVar29;
          if (fVar29 < fVar18) {
            local_da4 = fVar18;
          }
          local_da0 = local_da4;
        }
        else {
          local_d9c = fVar17;
          if (fVar17 < fVar18) {
            local_d9c = fVar18;
          }
          local_da0 = local_d9c;
        }
        if (-(b->mAABB).mExtents.y <= local_da0) {
          fVar19 = this->mLeafVerts[0].z - (b->mAABB).mCenter.z;
          fVar20 = this->mLeafVerts[1].z - (b->mAABB).mCenter.z;
          fVar21 = this->mLeafVerts[2].z - (b->mAABB).mCenter.z;
          if (fVar20 <= fVar19) {
            local_db4 = fVar21;
            if (fVar20 < fVar21) {
              local_db4 = fVar20;
            }
            local_db0 = local_db4;
          }
          else {
            local_dac = fVar21;
            if (fVar19 < fVar21) {
              local_dac = fVar19;
            }
            local_db0 = local_dac;
          }
          pfVar1 = &(b->mAABB).mExtents.z;
          if (local_db0 < *pfVar1 || local_db0 == *pfVar1) {
            if (fVar20 <= fVar19) {
              local_dc4 = fVar19;
              if (fVar19 < fVar21) {
                local_dc4 = fVar21;
              }
              local_dc0 = local_dc4;
            }
            else {
              local_dbc = fVar20;
              if (fVar20 < fVar21) {
                local_dbc = fVar21;
              }
              local_dc0 = local_dbc;
            }
            if (-(b->mAABB).mExtents.z <= local_dc0) {
              fVar27 = fVar15 - fVar14;
              fVar25 = fVar17 - fVar29;
              fVar22 = fVar20 - fVar19;
              fVar28 = fVar16 - fVar15;
              fVar26 = fVar18 - fVar17;
              fVar23 = fVar21 - fVar20;
              local_cd0 = fVar25 * fVar23 + -(fVar22 * fVar26);
              d = fVar22 * fVar28 + -(fVar27 * fVar23);
              normal.x = fVar27 * fVar26 + -(fVar25 * fVar28);
              fVar24 = -normal.x * fVar19 + -local_cd0 * fVar14 + -d * fVar29;
              for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
                if ((&local_cd0)[local_e8] <= 0.0) {
                  (&vmax.y)[local_e8] = (&pPVar7->x)[local_e8];
                  local_d8[local_e8] = -(&pPVar7->x)[local_e8];
                }
                else {
                  (&vmax.y)[local_e8] = -(&pPVar7->x)[local_e8];
                  local_d8[local_e8] = (&pPVar7->x)[local_e8];
                }
              }
              if (normal.x * vmin.x + local_cd0 * vmax.y + d * vmax.z + fVar24 <= 0.0) {
                if (normal.x * vmax.x + local_cd0 * local_d8[0] + d * local_d8[1] + fVar24 < 0.0) {
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                }
              }
              else {
                bVar4 = false;
              }
              if (bVar4) {
                if ((this->mFullPrimBoxTest & 1U) == 0) {
LAB_00281044:
                  local_c5c = 1;
                }
                else {
                  fey0 = fVar22 * fVar29 + -(fVar25 * fVar19);
                  fVar24 = fVar22 * fVar18 + -(fVar25 * fVar21);
                  fez0 = fVar24;
                  if (fVar24 < fey0) {
                    fez0 = fey0;
                    fey0 = fVar24;
                  }
                  fVar24 = ABS(fVar22) * (b->mAABB).mExtents.y + ABS(fVar25) * (b->mAABB).mExtents.z
                  ;
                  if ((fVar24 < fey0) || (fez0 < -fVar24)) {
                    local_c5c = 0;
                  }
                  else {
                    fey0 = fVar27 * fVar19 + -(fVar22 * fVar14);
                    fVar24 = fVar27 * fVar21 + -(fVar22 * fVar16);
                    fez0 = fVar24;
                    if (fVar24 < fey0) {
                      fez0 = fey0;
                      fey0 = fVar24;
                    }
                    fVar22 = ABS(fVar22) * pPVar7->x + ABS(fVar27) * (b->mAABB).mExtents.z;
                    if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                      local_c5c = 0;
                    }
                    else {
                      fey0 = fVar25 * fVar15 + -(fVar27 * fVar17);
                      fVar22 = fVar25 * fVar16 + -(fVar27 * fVar18);
                      fez0 = fVar22;
                      if (fVar22 < fey0) {
                        fez0 = fey0;
                        fey0 = fVar22;
                      }
                      fVar22 = ABS(fVar25) * pPVar7->x + ABS(fVar27) * (b->mAABB).mExtents.y;
                      if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                        local_c5c = 0;
                      }
                      else {
                        fey0 = fVar23 * fVar29 + -(fVar26 * fVar19);
                        fVar22 = fVar23 * fVar18 + -(fVar26 * fVar21);
                        fez0 = fVar22;
                        if (fVar22 < fey0) {
                          fez0 = fey0;
                          fey0 = fVar22;
                        }
                        fVar22 = ABS(fVar23) * (b->mAABB).mExtents.y +
                                 ABS(fVar26) * (b->mAABB).mExtents.z;
                        if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                          local_c5c = 0;
                        }
                        else {
                          fey0 = fVar28 * fVar19 + -(fVar23 * fVar14);
                          fVar21 = fVar28 * fVar21 + -(fVar23 * fVar16);
                          fez0 = fVar21;
                          if (fVar21 < fey0) {
                            fez0 = fey0;
                            fey0 = fVar21;
                          }
                          fVar21 = ABS(fVar23) * pPVar7->x + ABS(fVar28) * (b->mAABB).mExtents.z;
                          if ((fVar21 < fey0) || (fez0 < -fVar21)) {
                            local_c5c = 0;
                          }
                          else {
                            fey0 = fVar26 * fVar14 + -(fVar28 * fVar29);
                            fVar21 = fVar26 * fVar15 + -(fVar28 * fVar17);
                            fez0 = fVar21;
                            if (fVar21 < fey0) {
                              fez0 = fey0;
                              fey0 = fVar21;
                            }
                            fVar21 = ABS(fVar26) * pPVar7->x + ABS(fVar28) * (b->mAABB).mExtents.y;
                            if ((fVar21 < fey0) || (fez0 < -fVar21)) {
                              local_c5c = 0;
                            }
                            else {
                              fVar23 = this->mLeafVerts[0].x - this->mLeafVerts[2].x;
                              fVar22 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
                              fVar21 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
                              fey0 = fVar21 * fVar29 + -(fVar22 * fVar19);
                              fVar29 = fVar21 * fVar17 + -(fVar22 * fVar20);
                              fez0 = fVar29;
                              if (fVar29 < fey0) {
                                fez0 = fey0;
                                fey0 = fVar29;
                              }
                              fVar29 = ABS(fVar21) * (b->mAABB).mExtents.y +
                                       ABS(fVar22) * (b->mAABB).mExtents.z;
                              if ((fVar29 < fey0) || (fez0 < -fVar29)) {
                                local_c5c = 0;
                                bVar4 = true;
                              }
                              else {
                                fey0 = fVar23 * fVar19 + -(fVar21 * fVar14);
                                fVar14 = fVar23 * fVar20 + -(fVar21 * fVar15);
                                fez0 = fVar14;
                                if (fVar14 < fey0) {
                                  fez0 = fey0;
                                  fey0 = fVar14;
                                }
                                fVar14 = ABS(fVar21) * pPVar7->x +
                                         ABS(fVar23) * (b->mAABB).mExtents.z;
                                if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                                  local_c5c = 0;
                                  bVar4 = true;
                                }
                                else {
                                  fey0 = fVar22 * fVar15 + -(fVar23 * fVar17);
                                  fVar14 = fVar22 * fVar16 + -(fVar23 * fVar18);
                                  fez0 = fVar14;
                                  if (fVar14 < fey0) {
                                    fez0 = fey0;
                                    fey0 = fVar14;
                                  }
                                  fVar14 = ABS(fVar22) * pPVar7->x +
                                           ABS(fVar23) * (b->mAABB).mExtents.y;
                                  if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                                    local_c5c = 0;
                                    bVar4 = true;
                                  }
                                  else {
                                    bVar4 = false;
                                  }
                                }
                              }
                              if (!bVar4) goto LAB_00281044;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_c5c = 0;
              }
            }
            else {
              local_c5c = 0;
            }
          }
          else {
            local_c5c = 0;
          }
        }
        else {
          local_c5c = 0;
        }
      }
      else {
        local_c5c = 0;
      }
    }
    else {
      local_c5c = 0;
    }
  }
  else {
    local_c5c = 0;
  }
  if (local_c5c == 0) {
    return;
  }
  if ((b->mPosData & 1) == 0) {
    _CollideBoxTri(this,(AABBNoLeafNode *)b->mPosData);
  }
  else {
    uVar5 = (udword)(b->mPosData >> 1);
    pMVar3 = this->mIMesh0;
    piVar6 = (int *)((long)pMVar3->mTris->mVRef + (ulong)(uVar5 * pMVar3->mTriStride));
    pPVar7 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(*piVar6 * pMVar3->mVertexStride));
    pPVar8 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[1] * pMVar3->mVertexStride));
    pPVar9 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[2] * pMVar3->mVertexStride));
    pPVar13 = this->mLeafVerts;
    pPVar12 = this->mLeafVerts + 1;
    pPVar11 = this->mLeafVerts + 2;
    this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
    fVar14 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
    E2.y = pPVar12->x - pPVar13->x;
    E2.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
    fVar15 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
    local_7b0 = pPVar11->x - pPVar13->x;
    fStack_7ac = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
    E2.z = SUB84(E2._4_8_,4);
    fStack_7ac = SUB84(_local_7b0,4);
    local_7c8 = (undefined1  [4])(E2.z * fVar15 + -(fVar14 * fStack_7ac));
    local_7b0 = (float)_local_7b0;
    E2.y = (float)E2._4_8_;
    d1 = fVar14 * local_7b0 + -(E2.y * fVar15);
    N1.x = E2.y * fStack_7ac + -(E2.z * local_7b0);
    fVar14 = -N1.x * this->mLeafVerts[0].z +
             -(float)local_7c8 * pPVar13->x + -d1 * this->mLeafVerts[0].y;
    du2 = N1.x * pPVar7->z + (float)local_7c8 * pPVar7->x + d1 * pPVar7->y + fVar14;
    du0du1 = N1.x * pPVar8->z + (float)local_7c8 * pPVar8->x + d1 * pPVar8->y + fVar14;
    du0du2 = N1.x * pPVar9->z + (float)local_7c8 * pPVar9->x + d1 * pPVar9->y + fVar14;
    if (ABS(du2) < 1e-06) {
      du2 = 0.0;
    }
    if (ABS(du0du1) < 1e-06) {
      du0du1 = 0.0;
    }
    if (ABS(du0du2) < 1e-06) {
      du0du2 = 0.0;
    }
    if ((du2 * du0du1 <= 0.0) || (du2 * du0du2 <= 0.0)) {
      fVar14 = pPVar8->z - pPVar7->z;
      local_7fc = pPVar8->x - pPVar7->x;
      fStack_7f8 = pPVar8->y - pPVar7->y;
      fVar15 = pPVar9->z - pPVar7->z;
      N2.y = pPVar9->x - pPVar7->x;
      N2.z = pPVar9->y - pPVar7->y;
      E2.z = (float)((ulong)_local_7fc >> 0x20);
      fStack_7ac = SUB84(N2._4_8_,4);
      fVar29 = E2.z * fVar15 + -(fVar14 * fStack_7ac);
      local_7b0 = (float)N2._4_8_;
      E2.y = (float)_local_7fc;
      fVar16 = fVar14 * local_7b0 + -(E2.y * fVar15);
      fVar14 = E2.y * fStack_7ac + -(E2.z * local_7b0);
      fVar15 = -fVar14 * pPVar7->z + -fVar29 * pPVar7->x + -fVar16 * pPVar7->y;
      dv2 = fVar14 * this->mLeafVerts[0].z + fVar29 * pPVar13->x + fVar16 * this->mLeafVerts[0].y +
            fVar15;
      dv0dv1 = fVar14 * this->mLeafVerts[1].z + fVar29 * pPVar12->x + fVar16 * this->mLeafVerts[1].y
               + fVar15;
      dv0dv2 = fVar14 * this->mLeafVerts[2].z + fVar29 * pPVar11->x + fVar16 * this->mLeafVerts[2].y
               + fVar15;
      if (ABS(dv2) < 1e-06) {
        dv2 = 0.0;
      }
      if (ABS(dv0dv1) < 1e-06) {
        dv0dv1 = 0.0;
      }
      if (ABS(dv0dv2) < 1e-06) {
        dv0dv2 = 0.0;
      }
      if ((dv2 * dv0dv1 <= 0.0) || (dv2 * dv0dv2 <= 0.0)) {
        fVar15 = ABS(d1 * fVar14 + -(N1.x * fVar16));
        fVar14 = ABS(N1.x * fVar29 + -((float)local_7c8 * fVar14));
        bb = fVar15;
        if (fVar15 < fVar14) {
          bb = fVar14;
        }
        cc._2_2_ = (ushort)(fVar15 < fVar14);
        if (bb < ABS((float)local_7c8 * fVar16 + -(d1 * fVar29))) {
          cc._2_2_ = 2;
        }
        fVar14 = (&pPVar13->x)[(short)cc._2_2_];
        c = (&pPVar12->x)[(short)cc._2_2_];
        fVar15 = (&pPVar11->x)[(short)cc._2_2_];
        fVar16 = (&pPVar7->x)[(short)cc._2_2_];
        f = (&pPVar8->x)[(short)cc._2_2_];
        fVar29 = (&pPVar9->x)[(short)cc._2_2_];
        if (dv2 * dv0dv1 <= 0.0) {
          if (0.0 < dv2 * dv0dv2) {
            x0 = (fVar14 - c) * dv0dv1;
            x1 = (fVar15 - c) * dv0dv1;
            d_1 = dv0dv1 - dv2;
            e = dv0dv1 - dv0dv2;
          }
          else if (((0.0 < dv0dv1 * dv0dv2) || (dv2 != 0.0)) || (NAN(dv2))) {
            x0 = (c - fVar14) * dv2;
            x1 = (fVar15 - fVar14) * dv2;
            d_1 = dv2 - dv0dv1;
            e = dv2 - dv0dv2;
            c = fVar14;
          }
          else {
            if ((dv0dv1 != 0.0) || (NAN(dv0dv1))) {
              x0 = (fVar14 - c) * dv0dv1;
              x1 = (fVar15 - c) * dv0dv1;
              e = dv0dv1 - dv0dv2;
              dv0dv2 = dv0dv1;
            }
            else {
              if ((dv0dv2 == 0.0) && (!NAN(dv0dv2))) {
                local_75c = CoplanarTriTri((Point *)local_7c8,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                           pPVar9);
                goto LAB_00282bbc;
              }
              x0 = (fVar14 - fVar15) * dv0dv2;
              x1 = (c - fVar15) * dv0dv2;
              e = dv0dv2 - dv0dv1;
              c = fVar15;
            }
            d_1 = dv0dv2 - dv2;
          }
        }
        else {
          x0 = (fVar14 - fVar15) * dv0dv2;
          x1 = (c - fVar15) * dv0dv2;
          d_1 = dv0dv2 - dv2;
          e = dv0dv2 - dv0dv1;
          c = fVar15;
        }
        if (du2 * du0du1 <= 0.0) {
          if (du2 * du0du2 <= 0.0) {
            if (((0.0 < du0du1 * du0du2) || (du2 != 0.0)) || (NAN(du2))) {
              y0 = (f - fVar16) * du2;
              y1 = (fVar29 - fVar16) * du2;
              xx = du2 - du0du1;
              yy = du2 - du0du2;
              f = fVar16;
            }
            else {
              if ((du0du1 != 0.0) || (NAN(du0du1))) {
                y0 = (fVar16 - f) * du0du1;
                y1 = (fVar29 - f) * du0du1;
                yy = du0du1 - du0du2;
                du0du2 = du0du1;
              }
              else {
                if ((du0du2 == 0.0) && (!NAN(du0du2))) {
                  local_75c = CoplanarTriTri((Point *)local_7c8,pPVar13,pPVar12,pPVar11,pPVar7,
                                             pPVar8,pPVar9);
                  goto LAB_00282bbc;
                }
                y0 = (fVar16 - fVar29) * du0du2;
                y1 = (f - fVar29) * du0du2;
                yy = du0du2 - du0du1;
                f = fVar29;
              }
              xx = du0du2 - du2;
            }
          }
          else {
            y0 = (fVar16 - f) * du0du1;
            y1 = (fVar29 - f) * du0du1;
            xx = du0du1 - du2;
            yy = du0du1 - du0du2;
          }
        }
        else {
          y0 = (fVar16 - fVar29) * du0du2;
          y1 = (f - fVar29) * du0du2;
          xx = du0du2 - du2;
          yy = du0du2 - du0du1;
          f = fVar29;
        }
        fVar14 = d_1 * e;
        fVar15 = xx * yy;
        fVar16 = c * fVar14 * fVar15;
        fVar29 = x0 * e * fVar15 + fVar16;
        isect2[1] = x1 * d_1 * fVar15 + fVar16;
        fVar15 = f * fVar14 * fVar15;
        fVar16 = y0 * fVar14 * yy + fVar15;
        tmp_9 = y1 * fVar14 * xx + fVar15;
        isect2[0] = fVar29;
        if (isect2[1] < fVar29) {
          isect2[0] = isect2[1];
          isect2[1] = fVar29;
        }
        c_1 = fVar16;
        if (tmp_9 < fVar16) {
          c_1 = tmp_9;
          tmp_9 = fVar16;
        }
        if ((isect2[1] < c_1) || (tmp_9 < isect2[0])) {
          local_75c = 0;
        }
        else {
          local_75c = 1;
        }
      }
      else {
        local_75c = 0;
      }
    }
    else {
      local_75c = 0;
    }
LAB_00282bbc:
    if (local_75c != 0) {
      pCVar10 = &this->mPairs;
      if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar10,1);
      }
      uVar2 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar2 + 1;
      (this->mPairs).mEntries[uVar2] = uVar5;
      uVar5 = this->mLeafIndex;
      if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar10,1);
      }
      uVar2 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar2 + 1;
      (this->mPairs).mEntries[uVar2] = uVar5;
      (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
    }
  }
  if (((this->super_Collider).mFlags & 5) == 5) {
    return;
  }
  if ((b->mNegData & 1) == 0) {
    _CollideBoxTri(this,(AABBNoLeafNode *)b->mNegData);
    return;
  }
  uVar5 = (udword)(b->mNegData >> 1);
  pMVar3 = this->mIMesh0;
  piVar6 = (int *)((long)pMVar3->mTris->mVRef + (ulong)(uVar5 * pMVar3->mTriStride));
  pPVar7 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(*piVar6 * pMVar3->mVertexStride));
  pPVar8 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[1] * pMVar3->mVertexStride));
  pPVar9 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[2] * pMVar3->mVertexStride));
  pPVar13 = this->mLeafVerts;
  pPVar12 = this->mLeafVerts + 1;
  pPVar11 = this->mLeafVerts + 2;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar14 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
  E2_1.y = pPVar12->x - pPVar13->x;
  E2_1.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
  fVar15 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
  local_a48 = pPVar11->x - pPVar13->x;
  fStack_a44 = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
  E2_1.z = SUB84(E2_1._4_8_,4);
  fStack_a44 = SUB84(_local_a48,4);
  local_a60 = (undefined1  [4])(E2_1.z * fVar15 + -(fVar14 * fStack_a44));
  local_a48 = (float)_local_a48;
  E2_1.y = (float)E2_1._4_8_;
  d1_1 = fVar14 * local_a48 + -(E2_1.y * fVar15);
  N1_1.x = E2_1.y * fStack_a44 + -(E2_1.z * local_a48);
  fVar14 = -N1_1.x * this->mLeafVerts[0].z +
           -(float)local_a60 * pPVar13->x + -d1_1 * this->mLeafVerts[0].y;
  du2_1 = N1_1.x * pPVar7->z + (float)local_a60 * pPVar7->x + d1_1 * pPVar7->y + fVar14;
  du0du1_1 = N1_1.x * pPVar8->z + (float)local_a60 * pPVar8->x + d1_1 * pPVar8->y + fVar14;
  du0du2_1 = N1_1.x * pPVar9->z + (float)local_a60 * pPVar9->x + d1_1 * pPVar9->y + fVar14;
  if (ABS(du2_1) < 1e-06) {
    du2_1 = 0.0;
  }
  if (ABS(du0du1_1) < 1e-06) {
    du0du1_1 = 0.0;
  }
  if (ABS(du0du2_1) < 1e-06) {
    du0du2_1 = 0.0;
  }
  if ((du2_1 * du0du1_1 <= 0.0) || (du2_1 * du0du2_1 <= 0.0)) {
    fVar14 = pPVar8->z - pPVar7->z;
    local_a94 = pPVar8->x - pPVar7->x;
    fStack_a90 = pPVar8->y - pPVar7->y;
    fVar15 = pPVar9->z - pPVar7->z;
    N2_1.y = pPVar9->x - pPVar7->x;
    N2_1.z = pPVar9->y - pPVar7->y;
    E2_1.z = (float)((ulong)_local_a94 >> 0x20);
    fStack_a44 = SUB84(N2_1._4_8_,4);
    fVar29 = E2_1.z * fVar15 + -(fVar14 * fStack_a44);
    local_a48 = (float)N2_1._4_8_;
    E2_1.y = (float)_local_a94;
    fVar16 = fVar14 * local_a48 + -(E2_1.y * fVar15);
    fVar14 = E2_1.y * fStack_a44 + -(E2_1.z * local_a48);
    fVar15 = -fVar14 * pPVar7->z + -fVar29 * pPVar7->x + -fVar16 * pPVar7->y;
    dv2_1 = fVar14 * this->mLeafVerts[0].z + fVar29 * pPVar13->x + fVar16 * this->mLeafVerts[0].y +
            fVar15;
    dv0dv1_1 = fVar14 * this->mLeafVerts[1].z + fVar29 * pPVar12->x + fVar16 * this->mLeafVerts[1].y
               + fVar15;
    dv0dv2_1 = fVar14 * this->mLeafVerts[2].z + fVar29 * pPVar11->x + fVar16 * this->mLeafVerts[2].y
               + fVar15;
    if (ABS(dv2_1) < 1e-06) {
      dv2_1 = 0.0;
    }
    if (ABS(dv0dv1_1) < 1e-06) {
      dv0dv1_1 = 0.0;
    }
    if (ABS(dv0dv2_1) < 1e-06) {
      dv0dv2_1 = 0.0;
    }
    if ((dv2_1 * dv0dv1_1 <= 0.0) || (dv2_1 * dv0dv2_1 <= 0.0)) {
      fVar15 = ABS(d1_1 * fVar14 + -(N1_1.x * fVar16));
      fVar14 = ABS(N1_1.x * fVar29 + -((float)local_a60 * fVar14));
      bb_1 = fVar15;
      if (fVar15 < fVar14) {
        bb_1 = fVar14;
      }
      cc_1._2_2_ = (ushort)(fVar15 < fVar14);
      if (bb_1 < ABS((float)local_a60 * fVar16 + -(d1_1 * fVar29))) {
        cc_1._2_2_ = 2;
      }
      fVar14 = (&pPVar13->x)[(short)cc_1._2_2_];
      c_3 = (&pPVar12->x)[(short)cc_1._2_2_];
      fVar15 = (&pPVar11->x)[(short)cc_1._2_2_];
      fVar16 = (&pPVar7->x)[(short)cc_1._2_2_];
      f_1 = (&pPVar8->x)[(short)cc_1._2_2_];
      fVar29 = (&pPVar9->x)[(short)cc_1._2_2_];
      if (dv2_1 * dv0dv1_1 <= 0.0) {
        if (0.0 < dv2_1 * dv0dv2_1) {
          x0_1 = (fVar14 - c_3) * dv0dv1_1;
          x1_1 = (fVar15 - c_3) * dv0dv1_1;
          d_2 = dv0dv1_1 - dv2_1;
          e_1 = dv0dv1_1 - dv0dv2_1;
        }
        else if (((0.0 < dv0dv1_1 * dv0dv2_1) || (dv2_1 != 0.0)) || (NAN(dv2_1))) {
          x0_1 = (c_3 - fVar14) * dv2_1;
          x1_1 = (fVar15 - fVar14) * dv2_1;
          d_2 = dv2_1 - dv0dv1_1;
          e_1 = dv2_1 - dv0dv2_1;
          c_3 = fVar14;
        }
        else {
          if ((dv0dv1_1 != 0.0) || (NAN(dv0dv1_1))) {
            x0_1 = (fVar14 - c_3) * dv0dv1_1;
            x1_1 = (fVar15 - c_3) * dv0dv1_1;
            e_1 = dv0dv1_1 - dv0dv2_1;
            dv0dv2_1 = dv0dv1_1;
          }
          else {
            if ((dv0dv2_1 == 0.0) && (!NAN(dv0dv2_1))) {
              local_9f4 = CoplanarTriTri((Point *)local_a60,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                         pPVar9);
              goto LAB_00284828;
            }
            x0_1 = (fVar14 - fVar15) * dv0dv2_1;
            x1_1 = (c_3 - fVar15) * dv0dv2_1;
            e_1 = dv0dv2_1 - dv0dv1_1;
            c_3 = fVar15;
          }
          d_2 = dv0dv2_1 - dv2_1;
        }
      }
      else {
        x0_1 = (fVar14 - fVar15) * dv0dv2_1;
        x1_1 = (c_3 - fVar15) * dv0dv2_1;
        d_2 = dv0dv2_1 - dv2_1;
        e_1 = dv0dv2_1 - dv0dv1_1;
        c_3 = fVar15;
      }
      if (du2_1 * du0du1_1 <= 0.0) {
        if (du2_1 * du0du2_1 <= 0.0) {
          if (((0.0 < du0du1_1 * du0du2_1) || (du2_1 != 0.0)) || (NAN(du2_1))) {
            y0_1 = (f_1 - fVar16) * du2_1;
            y1_1 = (fVar29 - fVar16) * du2_1;
            xx_1 = du2_1 - du0du1_1;
            yy_1 = du2_1 - du0du2_1;
            f_1 = fVar16;
          }
          else {
            if ((du0du1_1 != 0.0) || (NAN(du0du1_1))) {
              y0_1 = (fVar16 - f_1) * du0du1_1;
              y1_1 = (fVar29 - f_1) * du0du1_1;
              yy_1 = du0du1_1 - du0du2_1;
              du0du2_1 = du0du1_1;
            }
            else {
              if ((du0du2_1 == 0.0) && (!NAN(du0du2_1))) {
                local_9f4 = CoplanarTriTri((Point *)local_a60,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                           pPVar9);
                goto LAB_00284828;
              }
              y0_1 = (fVar16 - fVar29) * du0du2_1;
              y1_1 = (f_1 - fVar29) * du0du2_1;
              yy_1 = du0du2_1 - du0du1_1;
              f_1 = fVar29;
            }
            xx_1 = du0du2_1 - du2_1;
          }
        }
        else {
          y0_1 = (fVar16 - f_1) * du0du1_1;
          y1_1 = (fVar29 - f_1) * du0du1_1;
          xx_1 = du0du1_1 - du2_1;
          yy_1 = du0du1_1 - du0du2_1;
        }
      }
      else {
        y0_1 = (fVar16 - fVar29) * du0du2_1;
        y1_1 = (f_1 - fVar29) * du0du2_1;
        xx_1 = du0du2_1 - du2_1;
        yy_1 = du0du2_1 - du0du1_1;
        f_1 = fVar29;
      }
      fVar14 = d_2 * e_1;
      fVar15 = xx_1 * yy_1;
      fVar16 = c_3 * fVar14 * fVar15;
      fVar29 = x0_1 * e_1 * fVar15 + fVar16;
      isect2_1[1] = x1_1 * d_2 * fVar15 + fVar16;
      fVar15 = f_1 * fVar14 * fVar15;
      fVar16 = y0_1 * fVar14 * yy_1 + fVar15;
      tmp_10 = y1_1 * fVar14 * xx_1 + fVar15;
      isect2_1[0] = fVar29;
      if (isect2_1[1] < fVar29) {
        isect2_1[0] = isect2_1[1];
        isect2_1[1] = fVar29;
      }
      c_4 = fVar16;
      if (tmp_10 < fVar16) {
        c_4 = tmp_10;
        tmp_10 = fVar16;
      }
      if ((isect2_1[1] < c_4) || (tmp_10 < isect2_1[0])) {
        local_9f4 = 0;
      }
      else {
        local_9f4 = 1;
      }
    }
    else {
      local_9f4 = 0;
    }
  }
  else {
    local_9f4 = 0;
  }
LAB_00284828:
  if (local_9f4 != 0) {
    pCVar10 = &this->mPairs;
    if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar10,1);
    }
    uVar2 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar2 + 1;
    (this->mPairs).mEntries[uVar2] = uVar5;
    uVar5 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar10,1);
    }
    uVar2 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar2 + 1;
    (this->mPairs).mEntries[uVar2] = uVar5;
    (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBNoLeafNode* b)
{
	// Perform triangle-box overlap test
	if(!TriBoxOverlap(b->mAABB.mCenter, b->mAABB.mExtents))	return;

	// Keep same triangle, deal with first child
	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	// Keep same triangle, deal with second child
	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}